

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O1

int writewbmp(Wbmp *wbmp,_func_void_int_void_ptr *putout,void *out)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  
  iVar3 = 0;
  (*putout)(0,out);
  (*putout)(0,out);
  putmbi(wbmp->width,putout,out);
  putmbi(wbmp->height,putout,out);
  if (0 < wbmp->height) {
    do {
      iVar1 = wbmp->width;
      if (iVar1 < 1) {
        uVar4 = 0;
        bVar6 = true;
      }
      else {
        iVar2 = 8;
        lVar5 = 0;
        uVar4 = 0;
        do {
          iVar2 = iVar2 + -1;
          uVar4 = (uint)(wbmp->bitmap[iVar1 * iVar3 + lVar5] == 1) << ((byte)iVar2 & 0x1f) | uVar4;
          if (iVar2 == 0) {
            (*putout)(uVar4,out);
            uVar4 = 0;
            iVar2 = 8;
          }
          iVar1 = wbmp->width;
          lVar5 = lVar5 + 1;
        } while ((int)lVar5 < iVar1);
        bVar6 = iVar2 == 8;
      }
      if (!bVar6) {
        (*putout)(uVar4,out);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < wbmp->height);
  }
  return 0;
}

Assistant:

int writewbmp(Wbmp *wbmp, void (*putout)(int c, void *out), void *out)
{
	int row, col;
	int bitpos, octet;

	/* Generate the header */
	putout(0, out); /* WBMP Type 0: B/W, Uncompressed bitmap */
	putout(0, out); /* FixHeaderField */

	/* Size of the image */
	putmbi(wbmp->width, putout, out);	/* width */
	putmbi(wbmp->height, putout, out);	/* height */


	/* Image data */
	for(row = 0; row < wbmp->height; row++) {
		bitpos = 8;
		octet = 0;

		for(col = 0; col < wbmp->width; col++) {
			octet |= ((wbmp->bitmap[row * wbmp->width + col] == 1) ? WBMP_WHITE : WBMP_BLACK) << --bitpos;
			if(bitpos == 0) {
				bitpos = 8;
				putout(octet, out);
				octet = 0;
			}
		}

		if(bitpos != 8) {
			putout(octet, out);
		}
	}

	return 0;
}